

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

NumericTable * __thiscall
notch::io::CSVReader::convertToNumeric
          (NumericTable *__return_storage_ptr__,CSVReader *this,MixedTable *t)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  undefined8 uVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type __n;
  ulong *puVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  long lVar8;
  pointer __x;
  size_t i;
  size_type sVar9;
  long lVar10;
  int iVar11;
  reference rVar12;
  float local_e4;
  NumericTable *local_e0;
  pointer local_d8;
  vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> *local_d0;
  string label;
  vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_> row;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  columnKeys;
  NumericRow nr;
  vector<bool,_std::allocator<bool>_> isNumeric;
  
  local_e0 = __return_storage_ptr__;
  pvVar3 = core::std::
           vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
           ::at(t,0);
  __n = ((long)(pvVar3->
               super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
               )._M_impl.super__Vector_impl_data._M_finish -
        (long)(pvVar3->
              super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
              )._M_impl.super__Vector_impl_data._M_start) / 0x28;
  core::std::vector<bool,_std::allocator<bool>_>::vector(&isNumeric,__n,(allocator_type *)&label);
  for (sVar9 = 0; __n != sVar9; sVar9 = sVar9 + 1) {
    bVar2 = isColumnNumeric(this,t,sVar9);
    rVar12 = core::std::vector<bool,_std::allocator<bool>_>::operator[](&isNumeric,sVar9);
    puVar4 = rVar12._M_p;
    if (bVar2) {
      uVar7 = rVar12._M_mask | *puVar4;
    }
    else {
      uVar7 = ~rVar12._M_mask & *puVar4;
    }
    *puVar4 = uVar7;
  }
  core::std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::vector(&columnKeys,__n,(allocator_type *)&label);
  (local_e0->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_e0->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_e0->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = (t->
             super__Vector_base<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  __x = (t->
        super__Vector_base<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  while (__x != local_d8) {
    local_d0 = __x;
    core::std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::
    vector(&row,__x);
    nr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    nr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    nr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    lVar10 = 0;
    lVar8 = 4;
    for (sVar9 = 0; __n != sVar9; sVar9 = sVar9 + 1) {
      rVar12 = core::std::vector<bool,_std::allocator<bool>_>::operator[](&isNumeric,sVar9);
      if ((*rVar12._M_p & rVar12._M_mask) == 0) {
        std::__cxx11::string::string
                  ((string *)&label,
                   (string *)
                   ((long)&(row.
                            super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
                            ._M_impl.super__Vector_impl_data._M_start)->value + lVar8));
        sVar5 = core::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)(&((columnKeys.
                               super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 +
                           lVar10),&label);
        this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)(&((columnKeys.
                         super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 +
                     lVar10);
        if (sVar5 == 0) {
          uVar1 = *(undefined8 *)
                   ((long)&((columnKeys.
                             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                           super__Rb_tree_header._M_node_count + lVar10);
          pmVar6 = core::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](this_00,&label);
          iVar11 = (int)uVar1;
          *pmVar6 = iVar11;
          local_e4 = (float)iVar11;
          core::std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    ((vector<float,_std::allocator<float>_> *)
                     &nr.super__Vector_base<float,_std::allocator<float>_>,&local_e4);
        }
        else {
          pmVar6 = core::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](this_00,&label);
          local_e4 = (float)*pmVar6;
          core::std::vector<float,_std::allocator<float>_>::emplace_back<float>
                    ((vector<float,_std::allocator<float>_> *)
                     &nr.super__Vector_base<float,_std::allocator<float>_>,&local_e4);
        }
        std::__cxx11::string::~string((string *)&label);
      }
      else {
        core::std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   &nr.super__Vector_base<float,_std::allocator<float>_>,
                   (value_type_conflict3 *)
                   ((long)&(row.
                            super__Vector_base<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>
                            ._M_impl.super__Vector_impl_data._M_start)->tag + lVar8));
      }
      lVar8 = lVar8 + 0x28;
      lVar10 = lVar10 + 0x30;
    }
    core::std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::push_back(local_e0,(value_type *)&nr.super__Vector_base<float,_std::allocator<float>_>);
    core::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&nr.super__Vector_base<float,_std::allocator<float>_>);
    core::std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>::
    ~vector(&row);
    __x = local_d0 + 1;
  }
  core::std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  ::~vector(&columnKeys);
  core::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&isNumeric.super__Bvector_base<std::allocator<bool>_>);
  return local_e0;
}

Assistant:

NumericTable
    convertToNumeric(const MixedTable &t) {
        // analyze table
        size_t ncols = t.at(0).size();
        std::vector<bool> isNumeric(ncols);
        for (size_t i = 0; i < ncols; ++i) {
            isNumeric[i] = isColumnNumeric(t, i);
        }
        // convert table
        std::vector<std::map<std::string, int>> columnKeys(ncols);
        NumericTable nt;
        for (auto row : t) {
            NumericRow nr;
            for (size_t i = 0; i < ncols; ++i) {
                if (isNumeric[i]) {
                    nr.push_back(row[i].value);
                } else { // a non-numeric label
                    auto label = row[i].str;
                    if (columnKeys[i].count(label)) { // a previosly seen label
                        int labelIndex = columnKeys[i][label];
                        nr.push_back(labelIndex);
                    } else { // new label
                        int labelIndex = columnKeys[i].size();
                        columnKeys[i][label] = labelIndex;
                        nr.push_back(labelIndex);
                    }
                }
            }
            nt.push_back(nr);
        }
        return nt;
    }